

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

bool __thiscall
JsUtil::
BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::Remove(BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *this,FunctionBody **key)

{
  int iVar1;
  Type piVar2;
  Type pSVar3;
  uint uVar4;
  ulong in_RAX;
  uint depth;
  uint unaff_R13D;
  uint uVar5;
  bool bVar6;
  ulong uStack_38;
  
  piVar2 = this->buckets;
  depth = 0;
  if (piVar2 == (Type)0x0) {
    uVar5 = 0;
    uStack_38 = in_RAX;
  }
  else {
    uVar4 = GetBucket((uint)((ulong)*key >> 3) | 1,this->bucketCount,this->modFunctionIndex);
    uStack_38 = (ulong)uVar4 << 0x20;
    unaff_R13D = piVar2[uVar4];
    if (-1 < (long)(int)unaff_R13D) {
      pSVar3 = this->entries;
      if (pSVar3[(int)unaff_R13D].
          super_DefaultHashedEntry<Js::FunctionBody_*,_Js::FunctionBody_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
          .super_KeyValueEntry<Js::FunctionBody_*,_Js::FunctionBody_*>.
          super_ValueEntry<Js::FunctionBody_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::FunctionBody_*,_Js::FunctionBody_*>_>
          .super_KeyValueEntryDataLayout2<Js::FunctionBody_*,_Js::FunctionBody_*>.key == *key) {
        depth = 0;
        uVar5 = 0xffffffff;
      }
      else {
        depth = 0;
        do {
          uVar5 = unaff_R13D;
          depth = depth + 1;
          unaff_R13D = pSVar3[uVar5].
                       super_DefaultHashedEntry<Js::FunctionBody_*,_Js::FunctionBody_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                       .super_KeyValueEntry<Js::FunctionBody_*,_Js::FunctionBody_*>.
                       super_ValueEntry<Js::FunctionBody_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::FunctionBody_*,_Js::FunctionBody_*>_>
                       .super_KeyValueEntryDataLayout2<Js::FunctionBody_*,_Js::FunctionBody_*>.next;
          if ((long)(int)unaff_R13D < 0) goto LAB_00907ede;
        } while (pSVar3[(int)unaff_R13D].
                 super_DefaultHashedEntry<Js::FunctionBody_*,_Js::FunctionBody_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                 .super_KeyValueEntry<Js::FunctionBody_*,_Js::FunctionBody_*>.
                 super_ValueEntry<Js::FunctionBody_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::FunctionBody_*,_Js::FunctionBody_*>_>
                 .super_KeyValueEntryDataLayout2<Js::FunctionBody_*,_Js::FunctionBody_*>.key != *key
                );
      }
      bVar6 = true;
      if (this->stats != (DictionaryStats *)0x0) {
        DictionaryStats::Lookup(this->stats,depth);
      }
      goto LAB_00907ef2;
    }
    uVar5 = 0xffffffff;
  }
LAB_00907ede:
  if (this->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this->stats,depth);
  }
  bVar6 = false;
LAB_00907ef2:
  if (bVar6 != false) {
    iVar1 = this->entries[(int)unaff_R13D].
            super_DefaultHashedEntry<Js::FunctionBody_*,_Js::FunctionBody_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
            .super_KeyValueEntry<Js::FunctionBody_*,_Js::FunctionBody_*>.
            super_ValueEntry<Js::FunctionBody_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::FunctionBody_*,_Js::FunctionBody_*>_>
            .super_KeyValueEntryDataLayout2<Js::FunctionBody_*,_Js::FunctionBody_*>.next;
    if ((int)uVar5 < 0) {
      this->buckets[uStack_38 >> 0x20] = iVar1;
    }
    else {
      this->entries[uVar5].
      super_DefaultHashedEntry<Js::FunctionBody_*,_Js::FunctionBody_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
      .super_KeyValueEntry<Js::FunctionBody_*,_Js::FunctionBody_*>.
      super_ValueEntry<Js::FunctionBody_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::FunctionBody_*,_Js::FunctionBody_*>_>
      .super_KeyValueEntryDataLayout2<Js::FunctionBody_*,_Js::FunctionBody_*>.next = iVar1;
    }
    pSVar3 = this->entries;
    pSVar3[(int)unaff_R13D].
    super_DefaultHashedEntry<Js::FunctionBody_*,_Js::FunctionBody_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
    .super_KeyValueEntry<Js::FunctionBody_*,_Js::FunctionBody_*>.
    super_ValueEntry<Js::FunctionBody_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::FunctionBody_*,_Js::FunctionBody_*>_>
    .super_KeyValueEntryDataLayout2<Js::FunctionBody_*,_Js::FunctionBody_*>.value =
         (FunctionBody *)0x0;
    pSVar3[(int)unaff_R13D].
    super_DefaultHashedEntry<Js::FunctionBody_*,_Js::FunctionBody_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
    .super_KeyValueEntry<Js::FunctionBody_*,_Js::FunctionBody_*>.
    super_ValueEntry<Js::FunctionBody_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::FunctionBody_*,_Js::FunctionBody_*>_>
    .super_KeyValueEntryDataLayout2<Js::FunctionBody_*,_Js::FunctionBody_*>.key =
         (FunctionBody *)0x0;
    SetNextFreeEntryIndex
              (this,this->entries + (int)unaff_R13D,-(uint)(this->freeCount == 0) | this->freeList);
    this->freeList = unaff_R13D;
    this->freeCount = this->freeCount + 1;
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Remove(this->stats,this->buckets[uStack_38 >> 0x20] == -1);
    }
  }
  return bVar6;
}

Assistant:

bool Remove(const TKey& key)
        {
            int i, last;
            uint targetBucket;
            if(FindEntryWithKey(key, &i, &last, &targetBucket))
            {
                RemoveAt(i, last, targetBucket);
                return true;
            }
            return false;
        }